

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveRemoveWindowsCb(Walker *pWalker,Expr *pExpr)

{
  Window *pWVar1;
  Window **ppWVar2;
  Window **ppWVar3;
  
  if ((pExpr->flags & 0x1000000) != 0) {
    ppWVar2 = &((pWalker->u).pSelect)->pWin;
    do {
      ppWVar3 = ppWVar2;
      pWVar1 = *ppWVar3;
      if (pWVar1 == (Window *)0x0) {
        return 0;
      }
      ppWVar2 = &pWVar1->pNextWin;
    } while (pWVar1 != (Window *)(pExpr->y).pTab);
    *ppWVar3 = pWVar1->pNextWin;
  }
  return 0;
}

Assistant:

static int resolveRemoveWindowsCb(Walker *pWalker, Expr *pExpr){
  if( ExprHasProperty(pExpr, EP_WinFunc) ){
    Window **pp;
    for(pp=&pWalker->u.pSelect->pWin; *pp; pp=&(*pp)->pNextWin){
      if( *pp==pExpr->y.pWin ){
        *pp = (*pp)->pNextWin;
        break;
      }    
    }
  }
  return WRC_Continue;
}